

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdiSubWindow::mousePressEvent(QMdiSubWindow *this,QMouseEvent *mouseEvent)

{
  int iVar1;
  int iVar2;
  QMdiSubWindowPrivate *this_00;
  QWidgetData *pQVar3;
  Representation RVar4;
  Representation RVar5;
  Representation RVar6;
  undefined4 uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  QPoint QVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar13 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar14 [16];
  QPoint local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  if (*(long *)&(this_00->super_QWidgetPrivate).field_0x10 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QWidget::mousePressEvent(&this->super_QWidget,mouseEvent);
      return;
    }
  }
  else {
    if (this_00->isInInteractiveMode == true) {
      QMdiSubWindowPrivate::leaveInteractiveMode(this_00);
    }
    if (this_00->isInRubberBandMode == true) {
      QMdiSubWindowPrivate::leaveRubberBandMode(this_00);
    }
    if (*(int *)(mouseEvent + 0x40) == 1) {
      if (this_00->currentOperation == None) {
        this_00->activeSubControl = this_00->hoveredSubControl;
        if (this_00->hoveredSubControl == SC_ComboBoxFrame) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            showSystemMenu(this);
            return;
          }
          goto LAB_00459b5e;
        }
        pQVar3 = (this->super_QWidget).data;
        iVar1 = (pQVar3->crect).x2.m_i;
        iVar2 = (pQVar3->crect).x1.m_i;
        iVar9 = QMdiSubWindowPrivate::titleBarHeight(this_00);
        QRegion::QRegion((QRegion *)&local_30,0,0,(iVar1 - iVar2) + 1,iVar9,Rectangle);
        QWidget::update(&this->super_QWidget,(QRegion *)&local_30);
        QRegion::~QRegion((QRegion *)&local_30);
      }
      else {
        QMdiSubWindowPrivate::updateCursor(this_00);
        uVar7 = QEventPoint::position();
        auVar14._0_8_ =
             (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
             extraout_XMM1_Qa;
        auVar14._8_8_ =
             (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
             extraout_XMM0_Qa;
        auVar14 = minpd(_DAT_0066f5d0,auVar14);
        auVar13._8_8_ = -(ulong)(-2147483648.0 < auVar14._8_8_);
        auVar13._0_8_ = -(ulong)(-2147483648.0 < auVar14._0_8_);
        uVar8 = movmskpd(uVar7,auVar13);
        uVar12 = 0x8000000000000000;
        if ((uVar8 & 1) != 0) {
          uVar12 = (ulong)(uint)(int)auVar14._0_8_ << 0x20;
        }
        uVar10 = 0x80000000;
        if ((uVar8 & 2) != 0) {
          uVar10 = (ulong)(uint)(int)auVar14._8_8_;
        }
        local_30 = (QPoint)(uVar10 | uVar12);
        QVar11 = QWidget::mapToParent(&this->super_QWidget,&local_30);
        this_00->mousePressPosition = QVar11;
        if ((this_00->resizeEnabled != false) || (this_00->moveEnabled == true)) {
          pQVar3 = (this->super_QWidget).data;
          RVar4.m_i = (pQVar3->crect).y1.m_i;
          RVar5.m_i = (pQVar3->crect).x2.m_i;
          RVar6.m_i = (pQVar3->crect).y2.m_i;
          (this_00->oldGeometry).x1 = (Representation)(pQVar3->crect).x1.m_i;
          (this_00->oldGeometry).y1 = (Representation)RVar4.m_i;
          (this_00->oldGeometry).x2 = (Representation)RVar5.m_i;
          (this_00->oldGeometry).y2 = (Representation)RVar6.m_i;
        }
        uVar8 = *(uint *)(*(long *)&(this->super_QWidget).field_0x8 + 0x388);
        if ((((uVar8 & 4) != 0) && (Move < this_00->currentOperation)) ||
           (((uVar8 & 8) != 0 && (this_00->currentOperation == Move)))) {
          QMdiSubWindowPrivate::enterRubberBandMode(this_00);
        }
      }
    }
    else {
      mouseEvent[0xc] = (QMouseEvent)0x0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
LAB_00459b5e:
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::mousePressEvent(QMouseEvent *mouseEvent)
{
    if (!parent()) {
        QWidget::mousePressEvent(mouseEvent);
        return;
    }

    Q_D(QMdiSubWindow);
    if (d->isInInteractiveMode)
        d->leaveInteractiveMode();
#if QT_CONFIG(rubberband)
    if (d->isInRubberBandMode)
        d->leaveRubberBandMode();
#endif

    if (mouseEvent->button() != Qt::LeftButton) {
        mouseEvent->ignore();
        return;
    }

    if (d->currentOperation != QMdiSubWindowPrivate::None) {
        d->updateCursor();
        d->mousePressPosition = mapToParent(mouseEvent->position().toPoint());
        if (d->resizeEnabled || d->moveEnabled)
            d->oldGeometry = geometry();
#if QT_CONFIG(rubberband)
        if ((testOption(QMdiSubWindow::RubberBandResize) && d->isResizeOperation())
            || (testOption(QMdiSubWindow::RubberBandMove) && d->isMoveOperation())) {
            d->enterRubberBandMode();
        }
#endif
        return;
    }

    d->activeSubControl = d->hoveredSubControl;
#if QT_CONFIG(menu)
    if (d->activeSubControl == QStyle::SC_TitleBarSysMenu)
        showSystemMenu();
    else
#endif
    update(QRegion(0, 0, width(), d->titleBarHeight()));
}